

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> __thiscall
ft::map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::BSTinsert
          (map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,node *curr,
          value_type *val)

{
  value_type *pvVar1;
  bool bVar2;
  node *pnVar3;
  pointer p_00;
  node *pnVar4;
  node *in_RCX;
  allocator<ft::treeNode<ft::pair<const_int,_int>_>_> *this_00;
  pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> pVar6;
  value_compare local_75 [13];
  treeNode<ft::pair<const_int,_int>_> local_68;
  treeNode<ft::pair<const_int,_int>_> *local_40;
  node *newNode;
  node *local_30;
  node *p;
  value_type *val_local;
  node *curr_local;
  map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this_local;
  undefined8 uVar5;
  
  p = in_RCX;
  val_local = val;
  curr_local = curr;
  this_local = this;
  treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  ::detach((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            *)curr);
  local_30 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
             ::NIL((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                    *)curr);
  do {
    pvVar1 = val_local;
    pnVar3 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
             ::NIL((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                    *)curr);
    if ((node *)pvVar1 == pnVar3) {
      this_00 = (allocator<ft::treeNode<ft::pair<const_int,_int>_>_> *)((long)&curr[1].left + 1);
      p_00 = allocator<ft::treeNode<ft::pair<const_int,_int>_>_>::allocate(this_00,1);
      local_40 = p_00;
      treeNode<ft::pair<const_int,_int>_>::treeNode(&local_68,&p->value);
      allocator<ft::treeNode<ft::pair<const_int,_int>_>_>::construct(this_00,p_00,&local_68);
      treeNode<ft::pair<const_int,_int>_>::~treeNode(&local_68);
      pnVar3 = local_30;
      local_40->parent = local_30;
      pnVar4 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               ::NIL((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                      *)curr);
      if (pnVar3 == pnVar4) {
        curr->left = local_40;
      }
      else {
        mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::value_comp
                  ((mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
                   curr);
        bVar2 = mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::
                value_compare::operator()(local_75,&local_40->value,&local_30->value);
        if (bVar2) {
          local_30->left = local_40;
        }
        else {
          local_30->right = local_40;
        }
      }
      pnVar3 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               ::NIL((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                      *)curr);
      local_40->left = pnVar3;
      pnVar3 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
               ::NIL((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                      *)curr);
      local_40->right = pnVar3;
      treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      ::attach((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                *)curr);
      pVar6 = make_pair<ft::treeNode<ft::pair<int_const,int>>*,bool>((ft *)this,local_40,true);
      uVar5 = pVar6._8_8_;
LAB_00118d74:
      pVar6._8_8_ = uVar5;
      pVar6.first = (first_type)this;
      return pVar6;
    }
    local_30 = (node *)val_local;
    bVar2 = mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::equal
                      ((mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                        *)curr,&p->value,val_local);
    if (bVar2) {
      treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
      ::attach((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                *)curr);
      pVar6 = make_pair<ft::treeNode<ft::pair<int_const,int>>*,bool>
                        ((ft *)this,(treeNode<ft::pair<const_int,_int>_> *)val_local,false);
      uVar5 = pVar6._8_8_;
      goto LAB_00118d74;
    }
    mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::value_comp
              ((mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)curr);
    bVar2 = mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::
            value_compare::operator()((value_compare *)((long)&newNode + 7),&p->value,val_local);
    if (bVar2) {
      val_local = *(value_type **)(val_local + 2);
    }
    else {
      val_local = *(value_type **)(val_local + 3);
    }
  } while( true );
}

Assistant:

ft::pair<node*, bool>	BSTinsert(node* curr, value_type const & val) {
		this->detach();

		node*	p = this->NIL();

		while (curr != this->NIL()) {
			p = curr;
			if (this->equal(val, curr->value)) {
				this->attach();
				return ft::make_pair(curr, false);
			}
			else if (this->value_comp()(val, curr->value))
				curr = curr->left;
			else
				curr = curr->right;
		}

		node*	newNode = this->m_alloc.allocate(1);
		this->m_alloc.construct(newNode, val);

		newNode->parent = p;

		if (p == this->NIL())
			this->m_tree.m_root = newNode;
		else if (this->value_comp()(newNode->value, p->value))
			p->left = newNode;
		else
			p->right = newNode;

		newNode->left = this->NIL();
		newNode->right = this->NIL();

		this->attach();

		return ft::make_pair(newNode, true);
	}